

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

sat_solver3 * sat_solver3_new(void)

{
  uint uVar1;
  sat_solver3 *psVar2;
  int **ppiVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  clause *pcVar7;
  int in_R8D;
  
  psVar2 = (sat_solver3 *)calloc(0x2a0,1);
  (psVar2->Mem).nEntries[0] = 0;
  (psVar2->Mem).nEntries[1] = 0;
  (psVar2->Mem).BookMarkH[0] = 0;
  (psVar2->Mem).BookMarkH[1] = 0;
  (psVar2->Mem).BookMarkE[0] = 0;
  (psVar2->Mem).BookMarkE[1] = 0;
  (psVar2->Mem).iPage[0] = 0;
  (psVar2->Mem).iPage[1] = 0;
  (psVar2->Mem).pPages = (int **)0x0;
  (psVar2->Mem).nPageSize = 0x11;
  (psVar2->Mem).uPageMask = 0x1ffff;
  (psVar2->Mem).uLearnedMask = 0x20000;
  (psVar2->Mem).nPagesAlloc = 0x100;
  ppiVar3 = (int **)calloc(0x100,8);
  (psVar2->Mem).pPages = ppiVar3;
  piVar4 = (int *)malloc(0x80000);
  *ppiVar3 = piVar4;
  piVar5 = (int *)malloc(0x80000);
  ppiVar3[1] = piVar5;
  (psVar2->Mem).iPage[0] = 0;
  (psVar2->Mem).iPage[1] = 1;
  *piVar4 = 2;
  *piVar5 = 2;
  psVar2->hLearnts = -1;
  uVar1 = Sat_MemAppend(&psVar2->Mem,(int *)0x0,2,0,in_R8D);
  psVar2->hBinary = uVar1;
  pcVar7 = (clause *)0x0;
  if (uVar1 != 0) {
    uVar6 = (psVar2->Mem).uPageMask & uVar1;
    if (uVar6 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                    ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    pcVar7 = (clause *)
             ((psVar2->Mem).pPages[(int)uVar1 >> ((byte)(psVar2->Mem).nPageSize & 0x1f)] +
             (int)uVar6);
  }
  psVar2->binary = pcVar7;
  psVar2->nLearntMax = 10000;
  psVar2->nLearntStart = 10000;
  psVar2->nLearntDelta = 1000;
  psVar2->nLearntRatio = 0x32;
  (psVar2->order).cap = 4;
  (psVar2->order).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->order).ptr = piVar4;
  (psVar2->trail_lim).cap = 4;
  (psVar2->trail_lim).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->trail_lim).ptr = piVar4;
  (psVar2->tagged).cap = 4;
  (psVar2->tagged).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->tagged).ptr = piVar4;
  (psVar2->act_clas).cap = 4;
  (psVar2->act_clas).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->act_clas).ptr = piVar4;
  (psVar2->stack).cap = 4;
  (psVar2->stack).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->stack).ptr = piVar4;
  (psVar2->unit_lits).cap = 4;
  (psVar2->unit_lits).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->unit_lits).ptr = piVar4;
  (psVar2->temp_clause).cap = 4;
  (psVar2->temp_clause).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->temp_clause).ptr = piVar4;
  (psVar2->conf_final).cap = 4;
  (psVar2->conf_final).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->conf_final).ptr = piVar4;
  psVar2->wlists = (veci *)0x0;
  psVar2->activity = (word *)0x0;
  psVar2->VarActType = 0;
  psVar2->ClaActType = 0;
  psVar2->size = 0;
  psVar2->cap = 0;
  psVar2->qhead = 0;
  psVar2->qtail = 0;
  psVar2->orderpos = (int *)0x0;
  psVar2->reasons = (int *)0x0;
  psVar2->trail = (lit *)0x0;
  psVar2->var_inc = 0x20;
  psVar2->var_decay = 0xffffffffffffffff;
  psVar2->cla_inc = 0x800;
  psVar2->cla_decay = 0xffffffff;
  (psVar2->act_vars).cap = 4;
  (psVar2->act_vars).size = 0;
  piVar4 = (int *)malloc(0x10);
  (psVar2->act_vars).ptr = piVar4;
  psVar2->root_level = 0;
  psVar2->random_seed = 91648253.0;
  psVar2->progress_estimate = 0.0;
  psVar2->verbosity = 0;
  (psVar2->stats).starts = 0;
  (psVar2->stats).clauses = 0;
  (psVar2->stats).learnts = 0;
  (psVar2->stats).decisions = 0;
  (psVar2->stats).propagations = 0;
  (psVar2->stats).inspects = 0;
  (psVar2->stats).conflicts = 0;
  (psVar2->stats).clauses_literals = 0;
  (psVar2->stats).learnts_literals = 0;
  (psVar2->stats).tot_literals = 0;
  return psVar2;
}

Assistant:

sat_solver3* sat_solver3_new(void)
{
    sat_solver3* s = (sat_solver3*)ABC_CALLOC( char, sizeof(sat_solver3));

//    Vec_SetAlloc_(&s->Mem, 15);
    Sat_MemAlloc_(&s->Mem, 17);
    s->hLearnts = -1;
    s->hBinary = Sat_MemAppend( &s->Mem, NULL, 2, 0, 0 );
    s->binary = clause_read( s, s->hBinary );

    s->nLearntStart = LEARNT_MAX_START_DEFAULT;  // starting learned clause limit
    s->nLearntDelta = LEARNT_MAX_INCRE_DEFAULT;  // delta of learned clause limit
    s->nLearntRatio = LEARNT_MAX_RATIO_DEFAULT;  // ratio of learned clause limit
    s->nLearntMax   = s->nLearntStart;

    // initialize vectors
    veci_new(&s->order);
    veci_new(&s->trail_lim);
    veci_new(&s->tagged);
//    veci_new(&s->learned);
    veci_new(&s->act_clas);
    veci_new(&s->stack);
//    veci_new(&s->model);
    veci_new(&s->unit_lits);
    veci_new(&s->temp_clause);
    veci_new(&s->conf_final);

    // initialize arrays
    s->wlists    = 0;
    s->activity  = 0;
    s->orderpos  = 0;
    s->reasons   = 0;
    s->trail     = 0;

    // initialize other vars
    s->size                   = 0;
    s->cap                    = 0;
    s->qhead                  = 0;
    s->qtail                  = 0;

    solver_init_activities(s);
    veci_new(&s->act_vars);

    s->root_level             = 0;
//    s->simpdb_assigns         = 0;
//    s->simpdb_props           = 0;
    s->random_seed            = 91648253;
    s->progress_estimate      = 0;
//    s->binary                 = (clause*)ABC_ALLOC( char, sizeof(clause) + sizeof(lit)*2);
//    s->binary->size_learnt    = (2 << 1);
    s->verbosity              = 0;

    s->stats.starts           = 0;
    s->stats.decisions        = 0;
    s->stats.propagations     = 0;
    s->stats.inspects         = 0;
    s->stats.conflicts        = 0;
    s->stats.clauses          = 0;
    s->stats.clauses_literals = 0;
    s->stats.learnts          = 0;
    s->stats.learnts_literals = 0;
    s->stats.tot_literals     = 0;
    return s;
}